

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O1

int format_decimal(int64_t v,char *p,int s)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  size_t __n;
  char *pcVar7;
  
  __n = (size_t)(uint)s;
  if (v < 0) {
    if (s < 1) {
      return -1;
    }
    iVar3 = 0x30;
  }
  else {
    uVar6 = s - 1;
    pcVar7 = p + ~(long)(int)uVar6;
    iVar3 = -1;
    lVar5 = -1;
    pcVar4 = p;
    do {
      uVar1 = v;
      pcVar4[__n - 1] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
      lVar5 = lVar5 + 1;
      pcVar4 = pcVar4 + -1;
      pcVar7 = pcVar7 + 1;
      if (s + iVar3 + 1 < 2) break;
      iVar3 = iVar3 + -1;
      v = uVar1 / 10;
    } while (9 < uVar1);
    if (uVar1 < 10) {
      memmove(p,pcVar4 + __n,((long)s - (long)(int)uVar6) + lVar5);
      iVar2 = 0;
      if (s - (int)lVar5 < 2) {
        return 0;
      }
      p = pcVar7 + __n;
      __n = (ulong)uVar6 - lVar5;
      iVar3 = 0x20;
      goto LAB_005d6e10;
    }
    if (s < 1) {
      return -1;
    }
    iVar3 = 0x39;
    p = pcVar4 + __n;
  }
  iVar2 = -1;
LAB_005d6e10:
  memset(p,iVar3,__n);
  return iVar2;
}

Assistant:

static int
format_decimal(int64_t v, char *p, int s)
{
	int len;
	char *h;

	len = s;
	h = p;

	/* Negative values in ar header are meaningless, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;
	do {
		*--p = (char)('0' + (v % 10));
		v /= 10;
	} while (--s > 0 && v > 0);

	if (v == 0) {
		memmove(h, p, len - s);
		p = h + len - s;
		while (s-- > 0)
			*p++ = ' ';
		return (0);
	}
	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '9';

	return (-1);
}